

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerNonConstFuncs(Builtins *this)

{
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  long in_RDI;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> intArg;
  shared_ptr<slang::ast::NonConstantFunction> *in_stack_fffffffffffff418;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffff420;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_fffffffffffff430;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *pvVar1;
  PredefinedIntegerType *in_stack_fffffffffffff440;
  allocator_type *in_stack_fffffffffffff448;
  Builtins *__args;
  PredefinedIntegerType *in_stack_fffffffffffff450;
  iterator in_stack_fffffffffffff458;
  int *__args_2;
  size_type in_stack_fffffffffffff460;
  ScalarType *__args_1;
  Symbol **__args_00;
  shared_ptr<slang::ast::SystemSubroutine> *method;
  SymbolKind typeKind;
  Builtins *this_00;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffff4b0;
  shared_ptr<slang::ast::SystemSubroutine> *subroutine;
  Builtins *in_stack_fffffffffffff4b8;
  Builtins *this_01;
  shared_ptr<slang::ast::SystemSubroutine> local_9b8;
  undefined4 local_9a4;
  undefined1 local_979;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined4 local_958;
  undefined4 local_954;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_940 [2];
  undefined1 local_900 [64];
  int local_8c0 [4];
  undefined1 local_8ad;
  undefined4 local_8ac;
  ScalarType local_898 [2];
  undefined1 local_7d1;
  undefined1 local_7a9;
  shared_ptr<slang::ast::SystemSubroutine> local_798 [2];
  undefined1 local_778 [32];
  undefined1 local_758 [59];
  undefined1 local_71d;
  undefined4 local_71c;
  undefined1 local_708 [984];
  SourceLocation local_330;
  SourceLocation local_328;
  SourceLocation local_320;
  Symbol *local_318;
  Symbol *local_310;
  Kind local_2f0;
  undefined4 local_2ec;
  SymbolIndex local_2c8;
  undefined4 local_2c4;
  allocator<const_slang::ast::Type_*> local_299;
  SourceLocation local_298;
  SourceLocation local_290;
  Symbol *local_288;
  char *local_280;
  SymbolIndex local_260;
  undefined4 local_25c;
  SymbolIndex local_238;
  undefined4 local_234;
  undefined4 local_210;
  undefined4 local_20c;
  allocator<const_slang::ast::Type_*> local_1e1;
  Type *local_1e0;
  Type *local_1d8;
  SourceLocation local_1d0;
  Scope *local_1c8;
  SymbolIndex local_1a8;
  undefined4 local_1a4;
  allocator<const_slang::ast::Type_*> local_179;
  SourceLocation local_178;
  SourceLocation local_170;
  Symbol *local_168;
  SyntaxNode *local_160;
  undefined4 local_140;
  undefined4 local_13c;
  SymbolIndex local_118;
  undefined4 local_114;
  SourceLocation local_f0 [5];
  undefined4 local_c4;
  undefined4 local_9c;
  undefined4 local_74;
  allocator<const_slang::ast::Type_*> local_39;
  Type *local_38;
  Type *local_30;
  pointer local_28;
  
  local_38 = (Type *)(in_RDI + 0x210);
  local_30 = (Type *)&local_38;
  local_28 = (pointer)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x786d9e);
  __l._M_len = in_stack_fffffffffffff460;
  __l._M_array = in_stack_fffffffffffff458;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff450,__l,in_stack_fffffffffffff448);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_39);
  local_74 = 0x62;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&>
            ((KnownSystemName *)in_stack_fffffffffffff448,in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x786e44);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x786e51);
  local_9c = 99;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&>
            ((KnownSystemName *)in_stack_fffffffffffff448,in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x786ec3);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x786ed0);
  local_c4 = 100;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::FloatingType&>
            ((KnownSystemName *)in_stack_fffffffffffff448,(FloatingType *)in_stack_fffffffffffff440)
  ;
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x786f42);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x786f4f);
  local_f0[0]._4_4_ = 0x65;
  local_f0[0]._0_4_ = 0;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x786fdc);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x786fe9);
  local_114 = 0x66;
  local_118 = 0;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787076);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x787083);
  local_13c = 0x67;
  local_178 = (SourceLocation)(in_RDI + 0x268);
  local_140 = 1;
  local_168 = (Symbol *)&local_178;
  local_160 = (SyntaxNode *)0x2;
  local_170 = local_178;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x7870f0);
  __l_00._M_len = in_stack_fffffffffffff460;
  __l_00._M_array = in_stack_fffffffffffff458;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff450,__l_00,in_stack_fffffffffffff448);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787187);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x787194);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffff430);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_179);
  local_1a4 = 0x45;
  local_1a8 = 1;
  local_1e0 = (Type *)(in_RDI + 0x5c0);
  local_1d0 = (SourceLocation)&local_1e0;
  local_1c8 = (Scope *)0x2;
  local_1d8 = local_1e0;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x787225);
  __l_01._M_len = in_stack_fffffffffffff460;
  __l_01._M_array = in_stack_fffffffffffff458;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff450,__l_01,in_stack_fffffffffffff448);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7872bc);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x7872c9);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffff430);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_1e1);
  local_20c = 0x46;
  local_210 = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,(VoidType *)in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787370);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x78737d);
  local_234 = 0x47;
  local_238 = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x78740a);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x787417);
  local_25c = 0x48;
  local_298 = (SourceLocation)(in_RDI + 0x210);
  local_260 = 2;
  local_288 = (Symbol *)&local_298;
  local_280 = (char *)0x2;
  local_290 = local_298;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x787484);
  __l_02._M_len = in_stack_fffffffffffff460;
  __l_02._M_array = in_stack_fffffffffffff458;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff450,__l_02,in_stack_fffffffffffff448);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x78751b);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x787528);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffff430);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_299);
  local_2c4 = 0x49;
  local_2c8 = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7875cf);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x7875dc);
  local_2ec._0_1_ = true;
  local_2ec._1_1_ = false;
  local_2ec._2_2_ = 0;
  local_330 = (SourceLocation)(in_RDI + 0x210);
  local_2f0 = Byte;
  local_318 = (Symbol *)&local_330;
  local_310 = (Symbol *)0x3;
  local_328 = local_330;
  local_320 = local_330;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x787651);
  __l_03._M_len = in_stack_fffffffffffff460;
  __l_03._M_array = in_stack_fffffffffffff458;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff450,__l_03,in_stack_fffffffffffff448);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7876e8);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x7876f5);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffff430);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)(local_708 + 0x3d7));
  local_708._940_4_ = 0x4b;
  local_708._936_4_ = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x78779c);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x7877a9);
  local_708._900_4_ = 0x4c;
  local_708._896_4_ = 0;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,(VoidType *)in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787836);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x787843);
  local_708._860_4_ = 0x4d;
  local_708._856_4_ = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7878d0);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x7878dd);
  local_708._820_4_ = 0x68;
  local_708._816_4_ = 0;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787962);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x78796f);
  local_708._780_4_ = 0x69;
  local_708._776_4_ = 0;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int>
            ((KnownSystemName *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
             (int *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7879f4);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x787a01);
  local_708._740_4_ = 0x6e;
  local_708._736_4_ = 3;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787a77);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787a84);
  local_708[700] = true;
  local_708[0x2bd] = false;
  local_708._702_2_ = 0;
  local_708._696_4_ = Byte;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787afa);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787b07);
  local_708._660_4_ = 0x70;
  local_708._656_4_ = 2;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787b7d);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787b8a);
  local_708._620_4_ = 0x71;
  local_708._616_4_ = LongInt;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787c00);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787c0d);
  local_708._580_4_ = 0x72;
  local_708._576_4_ = 2;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787c83);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787c90);
  local_708._540_4_ = 0x73;
  local_708._536_4_ = Definition;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787d06);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787d13);
  local_708._500_4_ = 0x74;
  local_708._496_4_ = 3;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DistributionFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::DistributionFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787d89);
  std::shared_ptr<slang::ast::builtins::DistributionFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DistributionFunc> *)0x787d96);
  local_708._460_4_ = 0x4e;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::ValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787df9);
  std::shared_ptr<slang::ast::builtins::ValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ValueChangeFunc> *)0x787e06);
  local_708._420_4_ = 0x4f;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::ValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787e69);
  std::shared_ptr<slang::ast::builtins::ValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ValueChangeFunc> *)0x787e76);
  local_708._380_4_ = 0x50;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::ValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787ed9);
  std::shared_ptr<slang::ast::builtins::ValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ValueChangeFunc> *)0x787ee6);
  local_708._340_4_ = 0x51;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::ValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787f49);
  std::shared_ptr<slang::ast::builtins::ValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ValueChangeFunc> *)0x787f56);
  local_708._300_4_ = 0x52;
  local_708[299] = 0;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x787fc9);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x787fd6);
  local_708[0x104] = true;
  local_708[0x105] = false;
  local_708._262_2_ = 0;
  local_708[0x103] = Bit >> 0x18;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788049);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x788056);
  local_708._220_4_ = 0x54;
  local_708[0xdb] = 0;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7880c9);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x7880d6);
  local_708._180_4_ = 0x55;
  local_708[0xb3] = Bit >> 0x18;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788149);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x788156);
  local_708._140_4_ = 0x56;
  local_708[0x8b] = 0;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7881c9);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x7881d6);
  local_708._100_4_ = 0x57;
  local_708[99] = 1;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788249);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x788256);
  local_708._60_4_ = 0x58;
  local_708[0x3b] = 1;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7882c9);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x7882d6);
  local_708._20_4_ = 0x59;
  local_708[0x13] = 1;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788349);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x788356);
  local_71c = 0x5a;
  local_71d = 1;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  this_01 = (Builtins *)local_708;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,in_stack_fffffffffffff4b0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7883c9);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x7883d6);
  local_758._20_4_ = 0x5b;
  local_758[0x13] = 1;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  subroutine = (shared_ptr<slang::ast::SystemSubroutine> *)(local_758 + 0x28);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalValueChangeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788449);
  std::shared_ptr<slang::ast::builtins::GlobalValueChangeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalValueChangeFunc> *)0x788456);
  std::make_shared<slang::ast::builtins::FErrorFunc>();
  this_00 = (Builtins *)local_758;
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::FErrorFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::FErrorFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7884a6);
  std::shared_ptr<slang::ast::builtins::FErrorFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FErrorFunc> *)0x7884b3);
  std::make_shared<slang::ast::builtins::FGetsFunc>();
  typeKind = (SymbolKind)((ulong)local_778 >> 0x20);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::FGetsFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::FGetsFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788503);
  std::shared_ptr<slang::ast::builtins::FGetsFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FGetsFunc> *)0x788510);
  local_7a9 = 1;
  std::make_shared<slang::ast::builtins::ScanfFunc,bool>((bool *)in_stack_fffffffffffff448);
  method = local_798;
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::ScanfFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::ScanfFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788570);
  std::shared_ptr<slang::ast::builtins::ScanfFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ScanfFunc> *)0x78857d);
  local_7d1 = 0;
  std::make_shared<slang::ast::builtins::ScanfFunc,bool>((bool *)in_stack_fffffffffffff448);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::ScanfFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::ScanfFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7885d7);
  std::shared_ptr<slang::ast::builtins::ScanfFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ScanfFunc> *)0x7885e4);
  std::make_shared<slang::ast::builtins::FReadFunc>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::FReadFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::FReadFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x78862e);
  std::shared_ptr<slang::ast::builtins::FReadFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FReadFunc> *)0x78863b);
  std::make_shared<slang::ast::builtins::SampledFunc>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SampledFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::SampledFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788685);
  std::shared_ptr<slang::ast::builtins::SampledFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SampledFunc> *)0x788692);
  std::make_shared<slang::ast::builtins::PastFunc>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::PastFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::PastFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7886dc);
  std::shared_ptr<slang::ast::builtins::PastFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::PastFunc> *)0x7886e9);
  local_898[0].super_IntegralType.super_Type.super_Symbol.originatingSyntax._4_1_ = true;
  local_898[0].super_IntegralType.super_Type.super_Symbol.originatingSyntax._5_1_ = false;
  local_898[0].super_IntegralType.super_Type.super_Symbol.originatingSyntax._6_2_ = 0;
  local_898[0].super_IntegralType.super_Type.super_Symbol.originatingSyntax._3_1_ = 1;
  std::make_shared<slang::ast::builtins::TimeScaleFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::TimeScaleFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::TimeScaleFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788756);
  std::shared_ptr<slang::ast::builtins::TimeScaleFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::TimeScaleFunc> *)0x788763);
  local_898[0].super_IntegralType.super_Type.super_Symbol.name._M_str._4_4_ = 0x6b;
  local_898[0].super_IntegralType.super_Type.super_Symbol.name._M_str._3_1_ = 1;
  std::make_shared<slang::ast::builtins::TimeScaleFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  __args_00 = &local_898[0].super_IntegralType.super_Type.super_Symbol.nextInScope;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::TimeScaleFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::TimeScaleFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7887d0);
  std::shared_ptr<slang::ast::builtins::TimeScaleFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::TimeScaleFunc> *)0x7887dd);
  local_8ac = 0x6c;
  local_8ad = Bit >> 0x18;
  std::make_shared<slang::ast::builtins::TimeScaleFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff448,(bool *)in_stack_fffffffffffff440);
  __args_1 = local_898;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::TimeScaleFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::TimeScaleFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x78884a);
  std::shared_ptr<slang::ast::builtins::TimeScaleFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::TimeScaleFunc> *)0x788857);
  std::make_shared<slang::ast::builtins::StacktraceFunc>();
  __args_2 = local_8c0;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StacktraceFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::StacktraceFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7888a1);
  std::shared_ptr<slang::ast::builtins::StacktraceFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StacktraceFunc> *)0x7888ae);
  std::make_shared<slang::ast::builtins::CountDriversFunc>();
  pvVar1 = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
           (local_900 + 0x20);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::CountDriversFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::CountDriversFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7888f8);
  std::shared_ptr<slang::ast::builtins::CountDriversFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CountDriversFunc> *)0x788905);
  std::make_shared<slang::ast::builtins::GetPatternFunc>();
  __args = (Builtins *)local_900;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GetPatternFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::GetPatternFunc> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x78894f);
  std::shared_ptr<slang::ast::builtins::GetPatternFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GetPatternFunc> *)0x78895c);
  std::make_shared<slang::ast::builtins::TestPlusArgsFunction,slang::ast::builtins::Builtins&>
            (__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::TestPlusArgsFunction,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::TestPlusArgsFunction> *)in_stack_fffffffffffff418);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7889ae);
  std::shared_ptr<slang::ast::builtins::TestPlusArgsFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::TestPlusArgsFunction> *)0x7889bb);
  local_954 = 0x3e;
  local_958 = 0;
  local_978 = 0;
  uStack_970 = 0;
  local_968 = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)0x7889fa
            );
  local_979 = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::ScalarType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
            ((KnownSystemName *)__args_00,__args_1,__args_2,pvVar1,(bool *)__args);
  pvVar1 = local_940;
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  addSystemMethod(this_00,typeKind,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788a76);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0x788a83);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(pvVar1);
  local_9a4 = 0x11c;
  std::make_shared<slang::ast::builtins::RandModeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::RandModeFunc,void>
            (in_stack_fffffffffffff420,
             (shared_ptr<slang::ast::builtins::RandModeFunc> *)in_stack_fffffffffffff418);
  addSystemMethod(this_00,typeKind,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788af2);
  std::shared_ptr<slang::ast::builtins::RandModeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RandModeFunc> *)0x788aff);
  std::make_shared<slang::ast::builtins::RandModeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::RandModeFunc,void>
            (&local_9b8,(shared_ptr<slang::ast::builtins::RandModeFunc> *)in_stack_fffffffffffff418)
  ;
  addSystemMethod(this_00,typeKind,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x788b61);
  std::shared_ptr<slang::ast::builtins::RandModeFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RandModeFunc> *)0x788b6e);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(pvVar1);
  return;
}

Assistant:

void Builtins::registerNonConstFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(...) addSystemSubroutine(std::make_shared<NonConstantFunction>(__VA_ARGS__))

    std::vector<const Type*> intArg = {&intType};

    REGISTER(KnownSystemName::Time, timeType);
    REGISTER(KnownSystemName::STime, uintType);
    REGISTER(KnownSystemName::RealTime, realTimeType);
    REGISTER(KnownSystemName::Random, intType, 0, intArg);
    REGISTER(KnownSystemName::URandom, uintType, 0, intArg);
    REGISTER(KnownSystemName::URandomRange, uintType, 1,
             std::vector<const Type*>{&uintType, &uintType});

    REGISTER(KnownSystemName::FOpen, intType, 1,
             std::vector<const Type*>{&stringType, &stringType});
    REGISTER(KnownSystemName::FClose, voidType, 1, intArg);
    REGISTER(KnownSystemName::FGetC, intType, 1, intArg);
    REGISTER(KnownSystemName::UngetC, intType, 2, std::vector<const Type*>{&intType, &intType});
    REGISTER(KnownSystemName::FTell, intType, 1, intArg);
    REGISTER(KnownSystemName::FSeek, intType, 3,
             std::vector<const Type*>{&intType, &intType, &intType});
    REGISTER(KnownSystemName::Rewind, intType, 1, intArg);
    REGISTER(KnownSystemName::FFlush, voidType, 0, intArg);
    REGISTER(KnownSystemName::FEof, intType, 1, intArg);

    REGISTER(KnownSystemName::ResetCount, intType, 0);
    REGISTER(KnownSystemName::ResetValue, intType, 0);

#undef REGISTER

#define FUNC(name, numArgs) addSystemSubroutine(std::make_shared<DistributionFunc>(name, numArgs))
    FUNC(KnownSystemName::DistUniform, 3);
    FUNC(KnownSystemName::DistNormal, 3);
    FUNC(KnownSystemName::DistExponential, 2);
    FUNC(KnownSystemName::DistPoisson, 2);
    FUNC(KnownSystemName::DistChiSquare, 2);
    FUNC(KnownSystemName::DistT, 2);
    FUNC(KnownSystemName::DistErlang, 3);
#undef FUNC

#define FUNC(name) addSystemSubroutine(std::make_shared<ValueChangeFunc>(name))
    FUNC(KnownSystemName::Rose);
    FUNC(KnownSystemName::Fell);
    FUNC(KnownSystemName::Stable);
    FUNC(KnownSystemName::Changed);
#undef FUNC

#define FUNC(name, isFuture) \
    addSystemSubroutine(std::make_shared<GlobalValueChangeFunc>(name, isFuture))
    FUNC(KnownSystemName::PastGclk, false);
    FUNC(KnownSystemName::RoseGclk, false);
    FUNC(KnownSystemName::FellGclk, false);
    FUNC(KnownSystemName::StableGclk, false);
    FUNC(KnownSystemName::ChangedGclk, false);
    FUNC(KnownSystemName::FutureGclk, true);
    FUNC(KnownSystemName::RisingGclk, true);
    FUNC(KnownSystemName::FallingGclk, true);
    FUNC(KnownSystemName::SteadyGclk, true);
    FUNC(KnownSystemName::ChangingGclk, true);
#undef FUNC

    addSystemSubroutine(std::make_shared<FErrorFunc>());
    addSystemSubroutine(std::make_shared<FGetsFunc>());
    addSystemSubroutine(std::make_shared<ScanfFunc>(true));
    addSystemSubroutine(std::make_shared<ScanfFunc>(false));
    addSystemSubroutine(std::make_shared<FReadFunc>());
    addSystemSubroutine(std::make_shared<SampledFunc>());
    addSystemSubroutine(std::make_shared<PastFunc>());
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::TimeUnit, true));
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::TimePrecision, true));
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::Scale, false));
    addSystemSubroutine(std::make_shared<StacktraceFunc>());
    addSystemSubroutine(std::make_shared<CountDriversFunc>());
    addSystemSubroutine(std::make_shared<GetPatternFunc>());
    addSystemSubroutine(std::make_shared<TestPlusArgsFunction>(*this));

    addSystemMethod(SymbolKind::EventType,
                    std::make_shared<NonConstantFunction>(KnownSystemName::Triggered, bitType, 0,
                                                          std::vector<const Type*>{},
                                                          /* isMethod */ true));

    addSystemMethod(SymbolKind::ClassProperty,
                    std::make_shared<RandModeFunc>(KnownSystemName::RandMode));
    addSystemMethod(SymbolKind::ConstraintBlock,
                    std::make_shared<RandModeFunc>(KnownSystemName::ConstraintMode));
}